

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O3

void __thiscall ncnn::Yolov3DetectionOutput::~Yolov3DetectionOutput(Yolov3DetectionOutput *this)

{
  int *piVar1;
  void *pvVar2;
  Allocator *pAVar3;
  
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__Yolov3DetectionOutput_005e6ed8;
  piVar1 = (this->anchors_scale).refcount;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      pvVar2 = (this->anchors_scale).data;
      pAVar3 = (this->anchors_scale).allocator;
      if (pAVar3 == (Allocator *)0x0) {
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
        }
      }
      else {
        (*pAVar3->_vptr_Allocator[3])();
      }
    }
  }
  (this->anchors_scale).cstep = 0;
  *(undefined8 *)((long)&(this->anchors_scale).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->anchors_scale).elemsize + 4) = 0;
  (this->anchors_scale).data = (void *)0x0;
  (this->anchors_scale).refcount = (int *)0x0;
  (this->anchors_scale).dims = 0;
  (this->anchors_scale).w = 0;
  (this->anchors_scale).h = 0;
  (this->anchors_scale).d = 0;
  (this->anchors_scale).c = 0;
  piVar1 = (this->mask).refcount;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      pvVar2 = (this->mask).data;
      pAVar3 = (this->mask).allocator;
      if (pAVar3 == (Allocator *)0x0) {
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
        }
      }
      else {
        (*pAVar3->_vptr_Allocator[3])();
      }
    }
  }
  (this->mask).cstep = 0;
  *(undefined8 *)((long)&(this->mask).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->mask).elemsize + 4) = 0;
  (this->mask).data = (void *)0x0;
  (this->mask).refcount = (int *)0x0;
  (this->mask).dims = 0;
  (this->mask).w = 0;
  (this->mask).h = 0;
  (this->mask).d = 0;
  (this->mask).c = 0;
  piVar1 = (this->biases).refcount;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      pvVar2 = (this->biases).data;
      pAVar3 = (this->biases).allocator;
      if (pAVar3 == (Allocator *)0x0) {
        if (pvVar2 != (void *)0x0) {
          free(pvVar2);
        }
      }
      else {
        (*pAVar3->_vptr_Allocator[3])();
      }
    }
  }
  (this->biases).cstep = 0;
  *(undefined8 *)((long)&(this->biases).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->biases).elemsize + 4) = 0;
  (this->biases).data = (void *)0x0;
  (this->biases).refcount = (int *)0x0;
  (this->biases).dims = 0;
  (this->biases).w = 0;
  (this->biases).h = 0;
  (this->biases).d = 0;
  (this->biases).c = 0;
  Layer::~Layer(&this->super_Layer);
  return;
}

Assistant:

Yolov3DetectionOutput::~Yolov3DetectionOutput()
{
    //delete softmax;
}